

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::buildProgramToTestShaderStage
          (ImageLoadStoreMultipleUniformsTest *this,shaderStage stage)

{
  int iVar1;
  uint uVar2;
  GLuint GVar3;
  size_t sVar4;
  undefined **ppuVar5;
  InternalError *this_00;
  TestError *this_01;
  char *src_tes;
  char *src_tcs;
  ulong uVar6;
  pointer_____offset_0x10___ *ppuVar7;
  char *src_gs;
  char *pcVar8;
  char *pcVar9;
  undefined **ppuVar10;
  bool is_program_built;
  string tested_shader_stage_code;
  stringstream stream;
  bool local_229;
  ulong local_228;
  shaderStage local_21c;
  char *local_218;
  long local_210;
  char local_208;
  undefined7 uStack_207;
  imageStoreCall local_1f8;
  imageStoreCall local_1f0;
  coordinatesVariableDeclaration local_1e8;
  ImageLoadStoreMultipleUniformsTest *local_1e0;
  coordinatesVariableDeclaration local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_229 = true;
  local_218 = &local_208;
  local_210 = 0;
  local_208 = '\0';
  uVar2 = getMaximumImageUniformsForStage(this,stage);
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (1 < (int)uVar2) {
    pcVar9 = ::glcts::fixed_sample_locations_values + 1;
    local_1e0 = this;
    if ((int)stage < 8) {
      if (stage != fragmentShaderStage) {
        if (stage != geometryShaderStage) {
LAB_009d54f3:
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Invalid shader stage",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                     ,0x245e);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pcVar9 = "layout(points) in;\nlayout(points, max_vertices = 1) out;\n\n";
      }
    }
    else if (stage == tesselationControlShaderStage) {
      pcVar9 = "layout(vertices = 4) out;\n\n";
    }
    else if (stage == tesselationEvalutaionShaderStage) {
      pcVar9 = "layout(quads, equal_spacing, ccw) in;\n\n";
    }
    else if (stage != vertexShaderStage) goto LAB_009d54f3;
    local_21c = stage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\n"
               ,0x5f);
    sVar4 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar4);
    local_228 = (ulong)uVar2;
    ppuVar10 = &gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
                getImageUniformDeclarationDetails(unsigned_int,gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::imageFormatDetails&)
                ::format_details;
    uVar6 = 0;
    do {
      ppuVar5 = ppuVar10;
      if (0xd < uVar6) {
        ppuVar5 = &gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
                   getImageUniformDeclarationDetails(unsigned_int,gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::imageFormatDetails&)
                   ::default_format_details;
      }
      pcVar9 = *ppuVar5;
      pcVar8 = ppuVar5[1];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
      iVar1 = (int)(ostream *)local_1a8;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar4 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") uniform ",10);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar4 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"u_image_",8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      uVar6 = uVar6 + 1;
      ppuVar10 = ppuVar10 + 5;
    } while (local_228 != uVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nvoid main()\n{\n",0xf);
    ppuVar10 = &gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
                getImageUniformDeclarationDetails(unsigned_int,gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::imageFormatDetails&)
                ::format_details;
    uVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      GVar3 = (GLuint)uVar6;
      local_1d8[0].m_row = 0;
      local_1d8[0].m_index = GVar3;
      anon_unknown_0::operator<<((ostream *)local_1a8,local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      local_1e8.m_row = 1;
      local_1e8.m_index = GVar3;
      anon_unknown_0::operator<<((ostream *)local_1a8,&local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      ppuVar5 = ppuVar10;
      if (0xd < uVar6) {
        ppuVar5 = &gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
                   getImageUniformDeclarationDetails(unsigned_int,gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::imageFormatDetails&)
                   ::default_format_details;
      }
      pcVar9 = ppuVar5[2];
      if (pcVar9 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar4 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"loaded_value_",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = imageLoad(",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"u_image_",8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      writeCoordinatesVariableNameToStream((ostream *)local_1a8,GVar3,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      local_1f0.m_row = 0;
      local_1f0.m_index = GVar3;
      anon_unknown_0::operator<<((ostream *)local_1a8,&local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      local_1f8.m_row = 1;
      local_1f8.m_index = GVar3;
      anon_unknown_0::operator<<((ostream *)local_1a8,&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      uVar6 = uVar6 + 1;
      if (uVar6 < local_228) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      }
      ppuVar10 = ppuVar10 + 5;
    } while (local_228 != uVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n\n",3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_218,(string *)local_1d8);
    this = local_1e0;
    stage = local_21c;
    if ((long *)CONCAT44(local_1d8[0].m_row,local_1d8[0].m_index) != local_1c8) {
      operator_delete((long *)CONCAT44(local_1d8[0].m_row,local_1d8[0].m_index),local_1c8[0] + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if (local_210 == 0) {
    GVar3 = 0;
    goto LAB_009d5449;
  }
  if ((int)stage < 8) {
    if (stage == fragmentShaderStage) {
      pcVar9 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
      ;
      pcVar8 = local_218;
LAB_009d5428:
      src_gs = (char *)0x0;
    }
    else {
      if (stage != geometryShaderStage) {
LAB_009d54bf:
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  ((TestError *)this_00,"Invalid shader stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                   ,0x237e);
        ppuVar7 = &tcu::TestError::typeinfo;
        goto LAB_009d54b0;
      }
      pcVar9 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
      ;
      pcVar8 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
      ;
      src_gs = local_218;
    }
    src_tes = (char *)0x0;
    src_tcs = (char *)0x0;
  }
  else if (stage == tesselationControlShaderStage) {
    pcVar9 = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
    ;
    src_tes = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(quads, equal_spacing, ccw) in;\n\nvoid main()\n{\n\n}\n"
    ;
    pcVar8 = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
    ;
    src_gs = (char *)0x0;
    src_tcs = local_218;
  }
  else {
    if (stage != tesselationEvalutaionShaderStage) {
      if (stage != vertexShaderStage) goto LAB_009d54bf;
      pcVar9 = local_218;
      pcVar8 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
      ;
      goto LAB_009d5428;
    }
    pcVar9 = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
    ;
    pcVar8 = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
    ;
    src_gs = (char *)0x0;
    src_tes = local_218;
    src_tcs = (char *)0x0;
  }
  GVar3 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,pcVar9,src_tcs,src_tes,src_gs,pcVar8,
                     &local_229);
  if (local_229 != false) {
LAB_009d5449:
    if (local_218 != &local_208) {
      operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
    }
    return GVar3;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,"Failed to build program",::glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
             ,0x2389);
  ppuVar7 = &tcu::InternalError::typeinfo;
LAB_009d54b0:
  __cxa_throw(this_00,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

GLuint buildProgramToTestShaderStage(shaderStage stage)
	{
		static const char* const boilerplate_fragment_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    discard;\n"
			"}\n";

		static const char* const boilerplate_tesselation_evaluation_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(quads, equal_spacing, ccw) in;\n"
			"\n"
			"void main()\n"
			"{\n"
			"\n"
			"}\n";

		static const char* const boilerplate_vertex_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(location = 0) in vec4 i_position;\n"
			"\n"
			"void main()\n"
			"{\n"
			"  gl_Position = i_position;\n"
			"}\n";

		const char* fragment_shader_code			   = boilerplate_fragment_shader_code;
		const char* geometry_shader_code			   = 0;
		bool		is_program_built				   = true;
		GLuint		program_object_id				   = 0;
		const char* tesselation_control_shader_code	= 0;
		const char* tesselation_evaluation_shader_code = 0;
		std::string tested_shader_stage_code;
		const char* vertex_shader_code = boilerplate_vertex_shader_code;

		/* Get source code for tested shader stage */
		prepareShaderForTestedShaderStage(stage, tested_shader_stage_code);

		if (true == tested_shader_stage_code.empty())
		{
			return 0;
		}

		/* Set up source code for all required stages */
		switch (stage)
		{
		case fragmentShaderStage:
			fragment_shader_code = tested_shader_stage_code.c_str();
			break;

		case geometryShaderStage:
			geometry_shader_code = tested_shader_stage_code.c_str();
			break;

		case tesselationControlShaderStage:
			tesselation_control_shader_code	= tested_shader_stage_code.c_str();
			tesselation_evaluation_shader_code = boilerplate_tesselation_evaluation_shader_code;
			break;

		case tesselationEvalutaionShaderStage:
			tesselation_evaluation_shader_code = tested_shader_stage_code.c_str();
			break;

		case vertexShaderStage:
			vertex_shader_code = tested_shader_stage_code.c_str();
			break;

		default:
			TCU_FAIL("Invalid shader stage");
		}

		/* Build program */
		program_object_id =
			BuildProgram(vertex_shader_code, tesselation_control_shader_code, tesselation_evaluation_shader_code,
						 geometry_shader_code, fragment_shader_code, &is_program_built);

		/* Check if program was built */
		if (false == is_program_built)
		{
			throw tcu::InternalError("Failed to build program", "", __FILE__, __LINE__);
		}

		/* Done */
		return program_object_id;
	}